

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

string * __thiscall
tvm::runtime::TVMType2String_abi_cxx11_(string *__return_storage_ptr__,runtime *this,TVMType t)

{
  ostringstream local_1a0 [8];
  ostringstream os;
  allocator<char> local_15;
  TVMType local_14;
  string *psStack_10;
  TVMType t_local;
  
  local_14.bits = (uint8_t)((ulong)this >> 8);
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  if (local_14.bits == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    operator<<((ostream *)local_1a0,local_14);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string TVMType2String(TVMType t) {
  if (t.bits == 0)
    return "";
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
  std::ostringstream os;
  os << t;
  return os.str();
#else
  if (t.bits == 1 && t.lanes == 1 && t.code == kDLUInt) {
    return "bool";
  }
  repr += TypeCode2Str(t.code);
  if (t.code == kHandle)
    return repr;
  repr += std::to_string(static_cast<int>(t.bits));
  if (t.lanes != 1) {
    repr += "x" + std::to_string(static_cast<int>(t.lanes));
  }
  return repr;
#endif
}